

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O2

unsigned_long __thiscall
CVmObjStrComp::match_strings
          (CVmObjStrComp *this,char *valstr,size_t vallen,char *refstr,size_t reflen)

{
  size_t *psVar1;
  long lVar2;
  wchar_t ch;
  wchar_t wVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  unsigned_long uVar7;
  size_t vlen;
  wchar_t *vp;
  ulong local_80;
  size_t local_70;
  wchar_t *local_68;
  long *local_60;
  utf8_ptr local_58;
  size_t local_50;
  char *local_48;
  utf8_ptr local_40;
  size_t local_38;
  
  local_60 = (long *)(this->super_CVmObject).ext_;
  lVar2 = local_60[1];
  local_80 = 0;
  local_58.p_ = valstr;
  local_50 = vallen;
  local_48 = valstr;
  local_40.p_ = refstr;
  local_38 = reflen;
LAB_002a31b5:
  do {
    if ((local_50 == 0) || (local_38 == 0)) {
      if (local_38 == 0 && local_50 == 0) {
        uVar7 = local_80 | 1;
      }
      else if (local_50 == 0) {
        sVar5 = utf8_ptr::s_len(local_48,(long)local_58.p_ - (long)local_48);
        uVar7 = 0;
        if (*local_60 - 1U < sVar5) {
          uVar7 = local_80 | 5;
        }
      }
      else {
LAB_002a3306:
        uVar7 = 0;
      }
      return uVar7;
    }
    ch = utf8_ptr::s_getch(local_58.p_);
    wVar3 = utf8_ptr::s_getch(local_40.p_);
    if (wVar3 != ch) {
      if (((int)lVar2 != 0) ||
         (iVar4 = t3_compare_case_fold_min(&local_58,&local_50,&local_40,&local_38), iVar4 != 0)) {
        if ((local_60[(ulong)((uint)wVar3 >> 8 & 0xff) + 2] != 0) &&
           (psVar1 = *(size_t **)
                      (local_60[(ulong)((uint)wVar3 >> 8 & 0xff) + 2] +
                      (ulong)(uint)(wVar3 & 0xff) * 8), psVar1 != (size_t *)0x0)) {
          iVar4 = t3_is_upper(ch);
          uVar6 = local_80 | psVar1[(ulong)(iVar4 == 0) + 2];
          local_68 = (wchar_t *)psVar1[1];
          local_70 = *psVar1;
          local_80 = uVar6;
          while ((local_50 != 0 && (local_70 != 0))) {
            if (*local_68 == ch) {
              utf8_ptr::inc(&local_58,&local_50);
              local_68 = local_68 + 1;
              local_70 = local_70 - 1;
            }
            else if (((int)lVar2 != 0) ||
                    (iVar4 = t3_compare_case_fold_min(&local_58,&local_50,&local_68,&local_70),
                    local_80 = uVar6 | 2, iVar4 != 0)) goto LAB_002a3306;
          }
          if (local_70 == 0) goto LAB_002a31f8;
        }
        goto LAB_002a3306;
      }
      local_80 = local_80 | 2;
      goto LAB_002a31b5;
    }
    utf8_ptr::inc(&local_58,&local_50);
LAB_002a31f8:
    utf8_ptr::inc(&local_40,&local_38);
  } while( true );
}

Assistant:

unsigned long CVmObjStrComp::match_strings(const char *valstr, size_t vallen,
                                           const char *refstr, size_t reflen)
{
    vmobj_strcmp_ext *ext = get_ext();
    utf8_ptr valp;
    utf8_ptr refp;
    unsigned long ret;
    int fold_case = !(ext->case_sensitive);

    /* set up to scan the strings */
    valp.set((char *)valstr);
    refp.set((char *)refstr);

    /* start with no return flags */
    ret = 0;

    /* scan the strings */
    while (vallen != 0 && reflen != 0)
    {
        /* get each character */
        wchar_t valch = valp.getch();
        wchar_t refch = refp.getch();

        /* check for an exact match first */
        if (refch == valch)
        {
            /* it's an exact match - skip this character in each string */
            valp.inc(&vallen);
            refp.inc(&reflen);
            continue;
        }

        /* check for a case-folded match if we're insensitive to case */
        if (fold_case
            && t3_compare_case_fold_min(valp, vallen, refp, reflen) == 0)
        {
            /* note in the flags that we have differing cases in the match */
            ret |= RF_CASEFOLD;

            /* keep going */
            continue;
        }

        /* check for a reference equivalence mapping */
        vmobj_strcmp_equiv **t1;
        vmobj_strcmp_equiv *eq;
        if ((t1 = ext->equiv[(refch >> 8) & 0xFF]) != 0
            && (eq = t1[refch & 0xFF]) != 0)
        {
            /* 
             *   In case we match, apply the appropriate flags added for the
             *   equivalence mapping, based on the case of the first value
             *   character we're testing.  (If we don't match, we'll simply
             *   return failure, so it won't matter that we messed with the
             *   flags.)  
             */
            ret |= (t3_is_upper(valch)
                    ? eq->uc_result_flags
                    : eq->lc_result_flags);

            /* match each character from the mapping string */
            const wchar_t *vp;
            size_t vlen;
            for (vp = eq->val_ch, vlen = eq->val_ch_cnt ;
                 vallen != 0 && vlen != 0 ; )
            {
                /* get this character */
                refch = *vp;
                
                /* if we have an exact match, keep going */
                if (refch == valch)
                {
                    /* matched - skip this character in each string */
                    valp.inc(&vallen);
                    ++vp, --vlen;

                    /* keep going */
                    continue;
                }

                /* check for a case-folded match if appropriate */
                if (fold_case
                    && t3_compare_case_fold_min(valp, vallen, vp, vlen) == 0)
                {
                    /* note the case-folded match and keep going */
                    ret |= RF_CASEFOLD;
                    continue;
                }

                /* no match */
                return 0;
            }

            /* 
             *   if we didn't make it to the end of the equivalence string,
             *   we must have run out of source before we matched the whole
             *   string, so we don'to have a match 
             */
            if (vlen != 0)
                return 0;

            /* 
             *   If we make it here, we matched the equivalence mapping.
             *   We've already skipped the input we matched, so skip the
             *   reference character and keep going.  
             */
            refp.inc(&reflen);
            continue;
        }

        /* we don't have anything else to try, so we don't have a match */
        return 0;
    }

    /* 
     *   If we ran out of reference string before we ran out of value
     *   string, we definitely do not have a match.  If we ran out of value
     *   string before we ran out reference string, we have a match as long
     *   as we matched at least the truncation length. 
     */
    if (reflen == 0 && vallen == 0)
    {
        /* 
         *   We ran out of both at the same time - it's a match.  Return the
         *   result code up to this point OR'd with RF_MATCH, which is our
         *   pre-defined bit that we set for every match.  
         */
        return (ret | RF_MATCH);
    }
    else if (vallen != 0)
    {
        /* we ran out of reference string first - it's not a match */
        return 0;
    }
    else
    {
        /* 
         *   We ran out of value string first, so it's a truncated match if
         *   we matched at least up to the truncation length (assuming we
         *   allow truncation at all).  If we didn't make it to the
         *   truncation length, or we don't allow truncation, it's not a
         *   match. 
         */
        size_t valcharlen = utf8_ptr::s_len(valstr, valp.getptr() - valstr);
        if (ext->trunc_len != 0 && valcharlen >= ext->trunc_len)
        {
            /* 
             *   it's a truncated match - return the result code up to this
             *   point, OR'd with RF_MATCH (our pre-defined bit we set for
             *   every match) and RF_TRUNC (our pre-defined bit we set for
             *   truncated matches) 
             */
            return (ret | RF_MATCH | RF_TRUNC);
        }
        else
        {
            /* didn't make it to the truncation length, so it's not a match */
            return 0;
        }
    }
}